

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboStateQueryTests.cpp
# Opt level: O2

void deqp::gles2::Functional::anon_unknown_1::checkColorAttachmentParam
               (TestContext *testCtx,CallLogWrapper *gl,GLenum target,GLenum pname,GLenum reference)

{
  ostringstream *this;
  bool bVar1;
  StateQueryMemoryWriteGuard<int> state;
  MessageBuilder local_1a8;
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&state);
  glu::CallLogWrapper::glGetFramebufferAttachmentParameteriv(gl,0x8d40,0x8ce0,target,&state.m_value)
  ;
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity(&state,testCtx)
  ;
  if ((bVar1) && (state.m_value != pname)) {
    local_1a8.m_log = testCtx->m_log;
    this = &local_1a8.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,"// ERROR: Expected ");
    std::ostream::operator<<(this,pname);
    std::operator<<((ostream *)this,"; got ");
    std::ostream::operator<<(this,state.m_value);
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"got invalid value");
    }
  }
  return;
}

Assistant:

void checkColorAttachmentParam(tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLenum target, GLenum pname, GLenum reference)
{
	checkAttachmentParam(testCtx, gl, target, GL_COLOR_ATTACHMENT0, pname, reference);
}